

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O1

void __thiscall Liby::http::HttpClient::get(HttpClient *this,Request *request,ReplyHandler *handler)

{
  size_t *psVar1;
  _Node *p_Var2;
  pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_> pStack_d8;
  
  std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>::
  pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>,_true>
            (&pStack_d8,request,handler);
  p_Var2 = std::__cxx11::
           list<std::pair<Liby::http::Request,std::function<void(Liby::http::Reply&)>>,std::allocator<std::pair<Liby::http::Request,std::function<void(Liby::http::Reply&)>>>>
           ::_M_create_node<std::pair<Liby::http::Request,std::function<void(Liby::http::Reply&)>>>
                     ((list<std::pair<Liby::http::Request,std::function<void(Liby::http::Reply&)>>,std::allocator<std::pair<Liby::http::Request,std::function<void(Liby::http::Reply&)>>>>
                       *)&this->requestLists_,&pStack_d8);
  std::__detail::_List_node_base::_M_hook(&p_Var2->super__List_node_base);
  psVar1 = &(this->requestLists_).
            super__List_base<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>,_std::allocator<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (pStack_d8.second.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*pStack_d8.second.super__Function_base._M_manager)
              ((_Any_data *)&pStack_d8.second,(_Any_data *)&pStack_d8.second,__destroy_functor);
  }
  Buffer::~Buffer(&pStack_d8.first.body_);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&pStack_d8.first.headers_._M_h);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pStack_d8.first.query_._M_dataplus._M_p != &pStack_d8.first.query_.field_2) {
    operator_delete(pStack_d8.first.query_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pStack_d8.first.uri_._M_dataplus._M_p != &pStack_d8.first.uri_.field_2) {
    operator_delete(pStack_d8.first.uri_._M_dataplus._M_p);
  }
  if ((this->http_conn_).super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    sendRequest(this);
  }
  return;
}

Assistant:

void Liby::http::HttpClient::get(const Request &request,
                                 const ReplyHandler &handler) {
    requestLists_.emplace_back(std::make_pair(request, handler));
    if (http_conn_)
        sendRequest();
}